

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_1;
  string token;
  stringstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  string *in_stack_fffffffffffffdc8;
  string *value_00;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  undefined6 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde6;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffde7;
  string local_208;
  string local_1e8 [32];
  stringstream local_1c8 [408];
  string local_30 [40];
  string *local_8;
  
  local_8 = in_RDI;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1c8,local_8,_Var2);
    std::__cxx11::string::string(local_1e8);
    while( true ) {
      bVar1 = std::ios::eof();
      uVar4 = false;
      if ((bVar1 & 1) == 0) {
        in_stack_fffffffffffffdd8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1c8,local_1e8,',');
        in_stack_fffffffffffffdd7 =
             std::ios::operator_cast_to_bool
                       ((ios *)(&in_stack_fffffffffffffdd8->_M_dataplus +
                               *(long *)(*(long *)in_stack_fffffffffffffdd8 + -0x18)));
        uVar4 = in_stack_fffffffffffffdd7;
      }
      if ((bool)uVar4 == false) break;
      value_00 = &local_208;
      std::__cxx11::string::string((string *)value_00);
      parse_value((string *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),value_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(bVar1,CONCAT16(uVar4,in_stack_fffffffffffffde0)),
                 in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  else {
    std::__cxx11::string::string(local_30);
    parse_value((string *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                in_stack_fffffffffffffdc8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffde7,
                           CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)),
               in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      if (text.empty()) {
        T v;
        parse_value(text, v);
        value.emplace_back(std::move(v));
        return;
      }
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }